

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CGL::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  int iVar1;
  char *pcVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  XMLElement *pXVar6;
  XMLElement *pXVar7;
  BSDF *pBVar8;
  undefined1 *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar16 [12];
  undefined1 auVar12 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  Vector3D transmittance;
  Vector3D reflectance;
  string type;
  allocator local_591;
  MaterialInfo *local_590;
  HDRImageBuffer *local_588;
  HDRImageBuffer *pHStack_580;
  HDRImageBuffer *local_578;
  XMLElement *local_568;
  ios_base *local_560;
  HDRImageBuffer *local_558;
  HDRImageBuffer *pHStack_550;
  HDRImageBuffer *local_548;
  HDRImageBuffer *local_538;
  HDRImageBuffer *pHStack_530;
  _func_int **local_528 [2];
  double local_518;
  HDRImageBuffer *local_510;
  _func_int **local_508;
  _func_int **local_500;
  HDRImageBuffer *local_4f8;
  _func_int **local_4f0;
  _func_int **local_4e8;
  _func_int **local_4e0;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined1 *local_2f8 [2];
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  string local_258 [16];
  undefined1 local_248 [16];
  string local_238 [16];
  undefined1 local_228 [16];
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar5 = (char *)(material->super_Instance).id._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(material->super_Instance).id,0,pcVar5,(ulong)pcVar2);
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar5 = (char *)(material->super_Instance).name._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(material->super_Instance).name,0,pcVar5,(ulong)pcVar2);
  (material->super_Instance).type = MATERIAL;
  local_590 = material;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"instance_effect","");
  pXVar3 = get_element(xml,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (pXVar3 == (XMLElement *)0x0) {
    exit(1);
  }
  pXVar4 = get_technique_common(pXVar3);
  pXVar3 = get_technique_CGL(pXVar3);
  if (pXVar3 != (XMLElement *)0x0) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,(char *)0x0);
    if (pXVar3 == (XMLElement *)0x0) {
      return;
    }
    local_560 = local_138;
    local_4e0 = (_func_int **)strtok;
    local_510 = (HDRImageBuffer *)&PTR__Sampler3D_002a5428;
    local_4e8 = (_func_int **)&PTR_f_002a5540;
    local_4f0 = (_func_int **)&PTR_f_002a54e0;
    local_4f8 = (HDRImageBuffer *)&PTR__Sampler2D_002a5368;
    local_500 = (_func_int **)&PTR_f_002a55a0;
    local_508 = (_func_int **)&PTR_f_002a5600;
    do {
      pcVar5 = tinyxml2::XMLNode::Value(&pXVar3->super_XMLNode);
      std::__cxx11::string::string((string *)&local_538,pcVar5,(allocator *)local_1b8);
      iVar1 = std::__cxx11::string::compare((char *)&local_538);
      if (iVar1 == 0) {
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"radiance","");
        pXVar4 = get_element(pXVar3,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_278,pcVar5,(allocator *)&local_558);
        local_588 = (HDRImageBuffer *)0x0;
        pHStack_580 = (HDRImageBuffer *)0x0;
        local_578 = (HDRImageBuffer *)0x0;
        std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_278,_S_out|_S_in);
        std::istream::_M_extract<double>((double *)local_1b8);
        std::istream::_M_extract<double>((double *)local_1b8);
        std::istream::_M_extract<double>((double *)local_1b8);
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_560);
        if (local_278[0] != local_268) {
          operator_delete(local_278[0]);
        }
        pBVar8 = (BSDF *)operator_new(0x50);
        pBVar8->_vptr_BSDF = local_4e0;
        pBVar8[1].reflectanceMap = local_588;
        pBVar8[1].normalMap = pHStack_580;
        pBVar8[2]._vptr_BSDF = (_func_int **)local_578;
        pBVar8[2].normalMap = local_510;
LAB_001168d2:
        local_590->bsdf = pBVar8;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_538);
        if (iVar1 == 0) {
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"reflectance","");
          pXVar4 = get_element(pXVar3,&local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)local_298,pcVar5,(allocator *)&local_558);
          local_588 = (HDRImageBuffer *)0x0;
          pHStack_580 = (HDRImageBuffer *)0x0;
          local_578 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_298,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0]);
          }
          pBVar8 = (BSDF *)operator_new(0x40);
          pBVar8->_vptr_BSDF = local_4e8;
          pBVar8[1].reflectanceMap = local_588;
          pBVar8[1].normalMap = pHStack_580;
          pBVar8[2]._vptr_BSDF = (_func_int **)local_578;
          goto LAB_001168d2;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_538);
        if (iVar1 == 0) {
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"reflectance","");
          get_element(pXVar3,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p);
          }
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"alpha","");
          pXVar4 = get_element(pXVar3,&local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p);
          }
          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"eta","");
          pXVar6 = get_element(pXVar3,&local_3d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
            operator_delete(local_3d8._M_dataplus._M_p);
          }
          local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"k","");
          pXVar7 = get_element(pXVar3,&local_3f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
            operator_delete(local_3f8._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          local_568 = (XMLElement *)atof(pcVar5);
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          std::__cxx11::string::string((string *)local_2b8,pcVar5,(allocator *)&local_558);
          local_588 = (HDRImageBuffer *)0x0;
          pHStack_580 = (HDRImageBuffer *)0x0;
          local_578 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_2b8,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          if (local_2b8[0] != local_2a8) {
            operator_delete(local_2b8[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          std::__cxx11::string::string((string *)local_2d8,pcVar5,&local_591);
          local_558 = (HDRImageBuffer *)0x0;
          pHStack_550 = (HDRImageBuffer *)0x0;
          local_548 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_2d8,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          if (local_2d8[0] != local_2c8) {
            operator_delete(local_2d8[0]);
          }
          pBVar8 = (BSDF *)operator_new(0x80);
          pBVar8->_vptr_BSDF = local_4f0;
          pBVar8[1].reflectanceMap = local_588;
          pBVar8[1].normalMap = pHStack_580;
          pBVar8[2]._vptr_BSDF = (_func_int **)local_578;
          pBVar8[2].normalMap = local_558;
          pBVar8[3]._vptr_BSDF = (_func_int **)pHStack_550;
          pBVar8[3].reflectanceMap = local_548;
          pBVar8[4]._vptr_BSDF = (_func_int **)(double)(float)(double)local_568;
          pBVar8[4].reflectanceMap = local_4f8;
          pBVar8[4].normalMap = local_510;
          goto LAB_001168d2;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_538);
        if (iVar1 == 0) {
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"transmittance","");
          pXVar4 = get_element(pXVar3,&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"roughness","");
          pXVar6 = get_element(pXVar3,&local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"ior","");
          pXVar7 = get_element(pXVar3,&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)local_2f8,pcVar5,(allocator *)&local_558);
          local_588 = (HDRImageBuffer *)0x0;
          pHStack_580 = (HDRImageBuffer *)0x0;
          local_578 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_2f8,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          auVar15._8_56_ = extraout_var_00;
          auVar15._0_8_ = extraout_XMM1_Qa_00;
          auVar16 = auVar15._4_12_;
          if (local_2f8[0] != local_2e8) {
            operator_delete(local_2f8[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          local_568 = (XMLElement *)atof(pcVar5);
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          local_518 = atof(pcVar5);
          pBVar8 = (BSDF *)operator_new(0x50);
          auVar11._0_4_ = (float)(double)local_568;
          auVar11._4_12_ = auVar16;
          auVar13._0_4_ = (float)local_518;
          auVar13._4_12_ = auVar16;
          auVar11 = vinsertps_avx(auVar13,auVar11,0x10);
          pBVar8->_vptr_BSDF = local_500;
          auVar11 = vcvtps2pd_avx(auVar11);
          pBVar8[1]._vptr_BSDF = (_func_int **)auVar11._0_8_;
          pBVar8[1].reflectanceMap = (HDRImageBuffer *)auVar11._8_8_;
          pBVar8[2]._vptr_BSDF = (_func_int **)local_588;
          pBVar8[2].reflectanceMap = pHStack_580;
          pBVar8[2].normalMap = local_578;
          goto LAB_001168d2;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_538);
        if (iVar1 == 0) {
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"transmittance","");
          pXVar4 = get_element(pXVar3,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p);
          }
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"reflectance","");
          pXVar6 = get_element(pXVar3,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p);
          }
          local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"roughness","");
          local_568 = get_element(pXVar3,&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p);
          }
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"ior","");
          pXVar7 = get_element(pXVar3,&local_4d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)local_318,pcVar5,(allocator *)&local_558);
          local_588 = (HDRImageBuffer *)0x0;
          pHStack_580 = (HDRImageBuffer *)0x0;
          local_578 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_318,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          if (local_318[0] != local_308) {
            operator_delete(local_318[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          std::__cxx11::string::string((string *)local_338,pcVar5,&local_591);
          local_558 = (HDRImageBuffer *)0x0;
          pHStack_550 = (HDRImageBuffer *)0x0;
          local_548 = (HDRImageBuffer *)0x0;
          std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_338,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_560);
          auVar14._8_56_ = extraout_var;
          auVar14._0_8_ = extraout_XMM1_Qa;
          auVar16 = auVar14._4_12_;
          if (local_338[0] != local_328) {
            operator_delete(local_338[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(local_568);
          local_568 = (XMLElement *)atof(pcVar5);
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          local_518 = atof(pcVar5);
          pBVar8 = (BSDF *)operator_new(0x70);
          auVar10._0_4_ = (float)(double)local_568;
          auVar10._4_12_ = auVar16;
          auVar12._0_4_ = (float)local_518;
          auVar12._4_12_ = auVar16;
          auVar11 = vinsertps_avx(auVar12,auVar10,0x10);
          pBVar8->_vptr_BSDF = local_508;
          auVar11 = vcvtps2pd_avx(auVar11);
          pBVar8[1]._vptr_BSDF = (_func_int **)auVar11._0_8_;
          pBVar8[1].reflectanceMap = (HDRImageBuffer *)auVar11._8_8_;
          pBVar8[2]._vptr_BSDF = (_func_int **)local_558;
          pBVar8[2].reflectanceMap = pHStack_550;
          pBVar8[2].normalMap = local_548;
          pBVar8[3].reflectanceMap = local_588;
          pBVar8[3].normalMap = pHStack_580;
          pBVar8[4]._vptr_BSDF = (_func_int **)local_578;
          goto LAB_001168d2;
        }
      }
      pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,(char *)0x0);
      if (local_538 != (HDRImageBuffer *)local_528) {
        operator_delete(local_538);
      }
      if (pXVar3 == (XMLElement *)0x0) {
        return;
      }
    } while( true );
  }
  if (pXVar4 == (XMLElement *)0x0) {
LAB_00116b4f:
    pBVar8 = (BSDF *)operator_new(0x50);
    pBVar8->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar8[1].reflectanceMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar8[1].normalMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar8[2]._vptr_BSDF = (_func_int **)0x3fe0000000000000;
  }
  else {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"phong/diffuse/color","");
    pXVar3 = get_element(pXVar4,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"lambert/diffuse/color","")
    ;
    pXVar4 = get_element(pXVar4,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (pXVar4 == (XMLElement *)0x0) {
      if (pXVar3 == (XMLElement *)0x0) goto LAB_00116b4f;
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string(local_258,pcVar5,(allocator *)&local_588);
      local_538 = (HDRImageBuffer *)0x0;
      pHStack_530 = (HDRImageBuffer *)0x0;
      local_528[0] = (_func_int **)0x0;
      std::__cxx11::stringstream::stringstream(local_1b8,local_258,_S_out|_S_in);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      puVar9 = local_248;
    }
    else {
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string(local_238,pcVar5,(allocator *)&local_588);
      local_538 = (HDRImageBuffer *)0x0;
      pHStack_530 = (HDRImageBuffer *)0x0;
      local_528[0] = (_func_int **)0x0;
      std::__cxx11::stringstream::stringstream(local_1b8,local_238,_S_out|_S_in);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      puVar9 = local_228;
    }
    if (*(undefined1 **)(puVar9 + -0x10) != puVar9) {
      operator_delete(*(undefined1 **)(puVar9 + -0x10));
    }
    pBVar8 = (BSDF *)operator_new(0x50);
    pBVar8->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar8[1].reflectanceMap = local_538;
    pBVar8[1].normalMap = pHStack_530;
    pBVar8[2]._vptr_BSDF = local_528[0];
  }
  pBVar8[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_002a5428;
  local_590->bsdf = pBVar8;
  return;
}

Assistant:

void ColladaParser::parse_material ( XMLElement* xml, MaterialInfo& material ) {

  // name & id
  material.id   = xml->Attribute( "id" );
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {

    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect); // common profile
    XMLElement* tech_CGL = get_technique_CGL(e_effect); // CGL profile

    if (tech_CGL) {
      XMLElement *e_bsdf = tech_CGL->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement *e_radiance  = get_element(e_bsdf, "radiance");
          Vector3D radiance = spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
        } else if (type == "microfacet") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_alpha = get_element(e_bsdf, "alpha");
          XMLElement* e_eta = get_element(e_bsdf, "eta");
          XMLElement* e_k = get_element(e_bsdf, "k");
          float alpha = atof(e_alpha->GetText());
          Vector3D eta = spectrum_from_string(string(e_eta->GetText()));
          Vector3D k = spectrum_from_string(string(e_k->GetText()));
          BSDF* bsdf = new MicrofacetBSDF(eta, k, alpha);
          material.bsdf = bsdf;
        } else if (type == "refraction") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }
        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_phong_diffuse = get_element(tech_common, "phong/diffuse/color");
      XMLElement* e_lambert_diffuse = get_element(tech_common, "lambert/diffuse/color");
      if (e_lambert_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_lambert_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else if (e_phong_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_phong_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else {
        material.bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}